

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::util_reportSolverOutcome(HModel *this,char *message)

{
  double *pdVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  int __x;
  long in_RDI;
  double dVar3;
  HModel *extraout_XMM0_Qa;
  double dVar4;
  double dlObjVal;
  double prObjVal;
  HModel *this_00;
  double local_30;
  double local_28;
  HModel *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RDI + 0x618) == 0) {
    printf("%s: OPTIMAL",in_RSI);
  }
  else {
    printf("%s: NOT-OPT",in_RSI);
  }
  __x = (int)in_RDI;
  dVar3 = computePrObj(in_stack_ffffffffffffffe0);
  std::abs(__x);
  this_00 = extraout_XMM0_Qa;
  std::abs(__x);
  local_30 = 1.0;
  pdVar1 = std::max<double>(&local_28,&local_30);
  pdVar1 = std::max<double>((double *)(in_RDI + 0x590),pdVar1);
  dVar4 = (double)this_00 / *pdVar1;
  uVar2 = std::__cxx11::string::c_str();
  printf("%16s: PrObj=%20.10e; DuObj=%20.10e; DlObj=%g; Iter=%10d; %10.3f",dVar3,
         *(undefined8 *)(in_RDI + 0x590),dVar4,*(undefined8 *)(in_RDI + 0x568),uVar2,
         (ulong)*(uint *)(in_RDI + 0x588));
  if (*(int *)(in_RDI + 0x618) == 0) {
    printf("\n");
  }
  else {
    util_reportModelStatus(this_00);
  }
  return;
}

Assistant:

void HModel::util_reportSolverOutcome(const char *message) {
#ifdef JAJH_dev
#else
  //  if (!intOption[INTOPT_PRINT_FLAG]) return;
#endif
  if (problemStatus == LP_Status_Optimal)
    printf("%s: OPTIMAL", message);
  else
    printf("%s: NOT-OPT", message);
#ifdef SCIP_dev
  double prObjVal = computePrObj();
  double dlObjVal = abs(prObjVal-objective)/max(objective, max(abs(prObjVal), 1.0));
  printf("%16s: PrObj=%20.10e; DuObj=%20.10e; DlObj=%g; Iter=%10d; %10.3f", modelName.c_str(),
	 prObjVal, objective, dlObjVal, numberIteration, totalTime);
#else
  printf("%16s %20.10e %10d %10.3f", modelName.c_str(),
	 objective, numberIteration, totalTime);
#endif
  if (problemStatus == LP_Status_Optimal)
    printf("\n");
  else
    util_reportModelStatus();
}